

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O2

void __thiscall t_generator::validate_input(t_generator *this)

{
  validate<t_enum*>(this,&this->program_->enums_);
  validate<t_typedef*>(this,&this->program_->typedefs_);
  validate<t_struct*>(this,&this->program_->objects_);
  validate<t_const*>(this,&this->program_->consts_);
  validate<t_service*>(this,&this->program_->services_);
  return;
}

Assistant:

void t_generator::validate_input() const {
  validate(program_->get_enums());
  validate(program_->get_typedefs());
  validate(program_->get_objects());
  validate(program_->get_consts());
  validate(program_->get_services());
}